

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.h
# Opt level: O0

void __thiscall pmx::PmxVertexSkinningSDEF::PmxVertexSkinningSDEF(PmxVertexSkinningSDEF *this)

{
  int local_14;
  int i;
  PmxVertexSkinningSDEF *this_local;
  
  PmxVertexSkinning::PmxVertexSkinning(&this->super_PmxVertexSkinning);
  (this->super_PmxVertexSkinning)._vptr_PmxVertexSkinning = (_func_int **)&PTR_Read_0013bb80;
  this->bone_index1 = 0;
  this->bone_index2 = 0;
  this->bone_weight = 0.0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    this->sdef_c[local_14] = 0.0;
    this->sdef_r0[local_14] = 0.0;
    this->sdef_r1[local_14] = 0.0;
  }
  return;
}

Assistant:

PmxVertexSkinningSDEF()
			: bone_index1(0)
			, bone_index2(0)
			, bone_weight(0.0f)
		{
			for (int i = 0; i < 3; ++i) {
				sdef_c[i] = 0.0f;
				sdef_r0[i] = 0.0f;
				sdef_r1[i] = 0.0f;
			}
		}